

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall
host_array_greater_than_or_equal_Test::~host_array_greater_than_or_equal_Test
          (host_array_greater_than_or_equal_Test *this)

{
  host_array_greater_than_or_equal_Test *this_local;
  
  ~host_array_greater_than_or_equal_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

CAMP_TEST_BEGIN(array, get_lvalue_reference)
{
   camp::array<int, 2> a = {1, 8};
   const camp::array<int, 2>& b{a};

   bool passed = camp::get<0>(a) == 1 &&
                 camp::get<1>(a) == 8 &&
                 camp::get<0>(b) == 1 &&
                 camp::get<1>(b) == 8;

   camp::get<0>(a) = 3;

   return passed &&
          camp::get<0>(a) == 3 &&
          camp::get<1>(a) == 8 &&
          camp::get<0>(b) == 3 &&
          camp::get<1>(b) == 8;
}